

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O3

int secp256k1_modinv64_mul_cmp_62
              (secp256k1_modinv64_signed62 *a,int alen,secp256k1_modinv64_signed62 *b,int64_t factor
              )

{
  long lVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  secp256k1_modinv64_signed62 *psVar12;
  long *extraout_RDX;
  long lVar13;
  long lVar14;
  long lVar15;
  secp256k1_modinv64_signed62 *b_00;
  secp256k1_modinv64_signed62 *a_00;
  secp256k1_modinv64_signed62 *psVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  bool bVar22;
  secp256k1_modinv64_signed62 bm;
  secp256k1_modinv64_signed62 am;
  secp256k1_modinv64_signed62 local_68;
  secp256k1_modinv64_signed62 local_40;
  
  a_00 = &local_68;
  secp256k1_modinv64_mul_62(&local_40,a,alen,1);
  secp256k1_modinv64_mul_62(&local_68,b,5,factor);
  lVar6 = 0;
  while ((ulong)local_40.v[lVar6] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)local_68.v[lVar6]) goto LAB_00142a8e;
    lVar6 = lVar6 + 1;
    if (lVar6 == 4) {
      uVar4 = 4;
      while( true ) {
        if (local_40.v[uVar4] < local_68.v[uVar4]) {
          return -1;
        }
        if (local_68.v[uVar4] < local_40.v[uVar4]) break;
        bVar22 = uVar4 == 0;
        uVar4 = uVar4 - 1;
        if (bVar22) {
          return 0;
        }
      }
      return 1;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_00142a8e:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  iVar5 = (int)a_00;
  if (iVar5 < 1) {
LAB_00142d3b:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_00142d40:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_00142d45:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_00142d4a:
    secp256k1_modinv64_update_fg_62_var_cold_6();
LAB_00142d4f:
    secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_00142d54:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    lVar6 = *(long *)factor;
    lVar1 = *(long *)(factor + 8);
    lVar18 = b->v[0];
    lVar15 = *extraout_RDX;
    uVar7 = lVar18 * lVar6;
    lVar13 = SUB168(SEXT816(lVar18) * SEXT816(lVar6),8);
    uVar8 = lVar15 * lVar1;
    lVar14 = SUB168(SEXT816(lVar15) * SEXT816(lVar1),8);
    lVar11 = (0x7fffffffffffffff - lVar14) - lVar13;
    if ((SBORROW8(0x7fffffffffffffff - lVar14,lVar13) != SBORROW8(lVar11,(ulong)(~uVar8 < uVar7)))
        != (long)(lVar11 - (ulong)(~uVar8 < uVar7)) < 0 && -1 < lVar14) goto LAB_00142d54;
    lVar11 = *(long *)(factor + 0x10);
    lVar2 = *(long *)(factor + 0x18);
    lVar14 = lVar14 + lVar13 + (ulong)CARRY8(uVar8,uVar7);
    uVar9 = lVar18 * lVar11;
    lVar13 = SUB168(SEXT816(lVar18) * SEXT816(lVar11),8);
    uVar10 = lVar15 * lVar2;
    lVar15 = SUB168(SEXT816(lVar15) * SEXT816(lVar2),8);
    uVar17 = (ulong)(-uVar10 - 1 < uVar9);
    lVar18 = (0x7fffffffffffffff - lVar15) - lVar13;
    if ((SBORROW8(0x7fffffffffffffff - lVar15,lVar13) != SBORROW8(lVar18,uVar17)) ==
        (long)(lVar18 - uVar17) < 0 || lVar15 < 0) {
      lVar18 = lVar15 + lVar13 + (ulong)CARRY8(uVar10,uVar9);
      if ((uVar8 + uVar7 & 0x3fffffffffffffff) != 0) goto LAB_00142d40;
      if ((uVar10 + uVar9 & 0x3fffffffffffffff) != 0) goto LAB_00142d45;
      uVar17 = uVar10 + uVar9 >> 0x3e | lVar18 * 4;
      uVar7 = uVar8 + uVar7 >> 0x3e | lVar14 * 4;
      lVar18 = lVar18 >> 0x3e;
      lVar14 = lVar14 >> 0x3e;
      if (iVar5 != 1) {
        a_00 = (secp256k1_modinv64_signed62 *)((ulong)a_00 & 0xffffffff);
        psVar12 = (secp256k1_modinv64_signed62 *)0x1;
        do {
          lVar15 = b->v[(long)psVar12];
          uVar9 = lVar15 * lVar6 + uVar7;
          lVar19 = SUB168(SEXT816(lVar15) * SEXT816(lVar6),8) + lVar14 +
                   (ulong)CARRY8(lVar15 * lVar6,uVar7);
          lVar13 = extraout_RDX[(long)psVar12];
          uVar8 = lVar13 * lVar1;
          lVar14 = SUB168(SEXT816(lVar13) * SEXT816(lVar1),8);
          if (-1 < lVar14) {
            uVar7 = (ulong)(-uVar8 - 1 < uVar9);
            lVar3 = (0x7fffffffffffffff - lVar14) - lVar19;
            if ((SBORROW8(0x7fffffffffffffff - lVar14,lVar19) != SBORROW8(lVar3,uVar7)) ==
                (long)(lVar3 - uVar7) < 0) goto LAB_00142c2a;
LAB_00142d31:
            secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_00142d36:
            secp256k1_modinv64_update_fg_62_var_cold_3();
            goto LAB_00142d3b;
          }
          lVar20 = (-0x8000000000000000 - lVar14) - (ulong)(uVar8 != 0);
          lVar3 = lVar19 - lVar20;
          if ((SBORROW8(lVar19,lVar20) != SBORROW8(lVar3,(ulong)(uVar9 < -uVar8))) !=
              (long)(lVar3 - (ulong)(uVar9 < -uVar8)) < 0) goto LAB_00142d31;
LAB_00142c2a:
          lVar14 = lVar19 + lVar14 + (ulong)CARRY8(uVar9,uVar8);
          uVar21 = lVar15 * lVar11 + uVar17;
          lVar15 = SUB168(SEXT816(lVar15) * SEXT816(lVar11),8) + lVar18 +
                   (ulong)CARRY8(lVar15 * lVar11,uVar17);
          uVar10 = lVar13 * lVar2;
          lVar18 = SUB168(SEXT816(lVar13) * SEXT816(lVar2),8);
          if (lVar18 < 0) {
            lVar19 = (-0x8000000000000000 - lVar18) - (ulong)(uVar10 != 0);
            lVar13 = lVar15 - lVar19;
            if ((SBORROW8(lVar15,lVar19) != SBORROW8(lVar13,(ulong)(uVar21 < -uVar10))) !=
                (long)(lVar13 - (ulong)(uVar21 < -uVar10)) < 0) goto LAB_00142d36;
          }
          else {
            uVar7 = (ulong)(-uVar10 - 1 < uVar21);
            lVar13 = (0x7fffffffffffffff - lVar18) - lVar15;
            if ((SBORROW8(0x7fffffffffffffff - lVar18,lVar15) != SBORROW8(lVar13,uVar7)) !=
                (long)(lVar13 - uVar7) < 0) goto LAB_00142d36;
          }
          lVar18 = lVar15 + lVar18 + (ulong)CARRY8(uVar21,uVar10);
          uVar7 = lVar14 * 4 | uVar9 + uVar8 >> 0x3e;
          b->v[(long)((long)psVar12[-1].v + 0x27)] = uVar9 + uVar8 & 0x3fffffffffffffff;
          uVar17 = lVar18 * 4 | uVar21 + uVar10 >> 0x3e;
          extraout_RDX[(long)((long)psVar12[-1].v + 0x27)] = uVar21 + uVar10 & 0x3fffffffffffffff;
          psVar12 = (secp256k1_modinv64_signed62 *)((long)psVar12->v + 1);
          lVar18 = lVar18 >> 0x3e;
          lVar14 = lVar14 >> 0x3e;
        } while (a_00 != psVar12);
      }
      if (lVar14 + -1 + (ulong)(0x7fffffffffffffff < uVar7) != -1) goto LAB_00142d4a;
      b->v[(long)iVar5 + -1] = uVar7;
      if (lVar18 + -1 + (ulong)(0x7fffffffffffffff < uVar17) == -1) {
        lVar6 = (long)iVar5 + -1;
        extraout_RDX[lVar6] = uVar17;
        return (int)lVar6;
      }
      goto LAB_00142d4f;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar6 = a_00->v[0];
  lVar1 = a_00->v[1];
  psVar12 = (secp256k1_modinv64_signed62 *)a_00->v[2];
  lVar18 = a_00->v[3];
  lVar15 = a_00->v[4];
  lVar11 = 0;
  do {
    if (a_00->v[lVar11] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
      psVar16 = psVar12;
LAB_00142f8a:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_00142f8f;
    }
    psVar16 = psVar12;
    if (0x3fffffffffffffff < a_00->v[lVar11]) goto LAB_00142f8a;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 5);
  psVar16 = a_00;
  iVar5 = secp256k1_modinv64_mul_cmp_62(a_00,5,b_00,-2);
  if (iVar5 < 1) {
LAB_00142f8f:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_00142f94:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_00142f99:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    psVar16 = a_00;
    iVar5 = secp256k1_modinv64_mul_cmp_62(a_00,5,b_00,1);
    if (-1 < iVar5) goto LAB_00142f94;
    uVar7 = lVar15 >> 0x3f;
    uVar9 = (long)b >> 0x3f;
    uVar8 = ((uVar7 & b_00->v[0]) + lVar6 ^ uVar9) - uVar9;
    uVar10 = ((long)uVar8 >> 0x3e) + (((uVar7 & b_00->v[1]) + lVar1 ^ uVar9) - uVar9);
    uVar21 = ((long)uVar10 >> 0x3e) + (((long)psVar12->v + (uVar7 & b_00->v[2]) ^ uVar9) - uVar9);
    uVar17 = ((long)uVar21 >> 0x3e) + (((uVar7 & b_00->v[3]) + lVar18 ^ uVar9) - uVar9);
    lVar6 = ((long)uVar17 >> 0x3e) + (((uVar7 & b_00->v[4]) + lVar15 ^ uVar9) - uVar9);
    uVar9 = lVar6 >> 0x3f;
    uVar7 = (b_00->v[0] & uVar9) + (uVar8 & 0x3fffffffffffffff);
    psVar16 = (secp256k1_modinv64_signed62 *)((b_00->v[4] & uVar9) + lVar6);
    uVar10 = ((long)uVar7 >> 0x3e) + (b_00->v[1] & uVar9) + (uVar10 & 0x3fffffffffffffff);
    uVar8 = ((long)uVar10 >> 0x3e) + (b_00->v[2] & uVar9) + (uVar21 & 0x3fffffffffffffff);
    uVar17 = ((long)uVar8 >> 0x3e) + (b_00->v[3] & uVar9) + (uVar17 & 0x3fffffffffffffff);
    uVar9 = (long)psVar16->v + ((long)uVar17 >> 0x3e);
    a_00->v[0] = uVar7 & 0x3fffffffffffffff;
    a_00->v[1] = uVar10 & 0x3fffffffffffffff;
    a_00->v[2] = uVar8 & 0x3fffffffffffffff;
    a_00->v[3] = uVar17 & 0x3fffffffffffffff;
    a_00->v[4] = uVar9;
    if (0x3fffffffffffffff < uVar9) goto LAB_00142f99;
    psVar16 = a_00;
    iVar5 = secp256k1_modinv64_mul_cmp_62(a_00,5,b_00,0);
    if (-1 < iVar5) {
      iVar5 = secp256k1_modinv64_mul_cmp_62(a_00,5,b_00,1);
      if (iVar5 < 0) {
        return iVar5;
      }
      goto LAB_00142fa3;
    }
  }
  a_00 = psVar16;
  secp256k1_modinv64_normalize_62_cold_2();
LAB_00142fa3:
  secp256k1_modinv64_normalize_62_cold_1();
  if ((long)a_00 < 1) {
    a_00 = (secp256k1_modinv64_signed62 *)-(long)a_00;
  }
  return (int)a_00;
}

Assistant:

static int secp256k1_modinv64_mul_cmp_62(const secp256k1_modinv64_signed62 *a, int alen, const secp256k1_modinv64_signed62 *b, int64_t factor) {
    int i;
    secp256k1_modinv64_signed62 am, bm;
    secp256k1_modinv64_mul_62(&am, a, alen, 1); /* Normalize all but the top limb of a. */
    secp256k1_modinv64_mul_62(&bm, b, 5, factor);
    for (i = 0; i < 4; ++i) {
        /* Verify that all but the top limb of a and b are normalized. */
        VERIFY_CHECK(am.v[i] >> 62 == 0);
        VERIFY_CHECK(bm.v[i] >> 62 == 0);
    }
    for (i = 4; i >= 0; --i) {
        if (am.v[i] < bm.v[i]) return -1;
        if (am.v[i] > bm.v[i]) return 1;
    }
    return 0;
}